

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_zlib_compress
               (uchar **out,size_t *outsize,uchar *in,size_t insize,
               LodePNGCompressSettings *settings)

{
  uint value;
  uint ADLER32;
  uint FCHECK;
  uint CMFFLG;
  uint FDICT;
  uint FLEVEL;
  uint CMF;
  size_t deflatesize;
  uchar *deflatedata;
  size_t sStack_50;
  uint error;
  size_t i;
  ucvector outv;
  LodePNGCompressSettings *settings_local;
  size_t insize_local;
  uchar *in_local;
  size_t *outsize_local;
  uchar **out_local;
  
  deflatesize = 0;
  _FLEVEL = 0;
  outv.allocsize = (size_t)settings;
  ucvector_init_buffer((ucvector *)&i,*out,*outsize);
  ucvector_push_back((ucvector *)&i,'x');
  ucvector_push_back((ucvector *)&i,'\x01');
  deflatedata._4_4_ =
       deflate((uchar **)&deflatesize,(size_t *)&FLEVEL,in,insize,
               (LodePNGCompressSettings *)outv.allocsize);
  if (deflatedata._4_4_ == 0) {
    value = adler32(in,(uint)insize);
    for (sStack_50 = 0; sStack_50 != _FLEVEL; sStack_50 = sStack_50 + 1) {
      ucvector_push_back((ucvector *)&i,*(uchar *)(deflatesize + sStack_50));
    }
    lodepng_free((void *)deflatesize);
    lodepng_add32bitInt((ucvector *)&i,value);
  }
  *out = (uchar *)i;
  *outsize = (size_t)outv.data;
  return deflatedata._4_4_;
}

Assistant:

unsigned lodepng_zlib_compress(unsigned char** out, size_t* outsize, const unsigned char* in,
                               size_t insize, const LodePNGCompressSettings* settings)
{
  /*initially, *out must be NULL and outsize 0, if you just give some random *out
  that's pointing to a non allocated buffer, this'll crash*/
  ucvector outv;
  size_t i;
  unsigned error;
  unsigned char* deflatedata = 0;
  size_t deflatesize = 0;

  /*zlib data: 1 byte CMF (CM+CINFO), 1 byte FLG, deflate data, 4 byte ADLER32 checksum of the Decompressed data*/
  unsigned CMF = 120; /*0b01111000: CM 8, CINFO 7. With CINFO 7, any window size up to 32768 can be used.*/
  unsigned FLEVEL = 0;
  unsigned FDICT = 0;
  unsigned CMFFLG = 256 * CMF + FDICT * 32 + FLEVEL * 64;
  unsigned FCHECK = 31 - CMFFLG % 31;
  CMFFLG += FCHECK;

  /*ucvector-controlled version of the output buffer, for dynamic array*/
  ucvector_init_buffer(&outv, *out, *outsize);

  ucvector_push_back(&outv, (unsigned char)(CMFFLG >> 8));
  ucvector_push_back(&outv, (unsigned char)(CMFFLG & 255));

  error = deflate(&deflatedata, &deflatesize, in, insize, settings);

  if(!error)
  {
    unsigned ADLER32 = adler32(in, (unsigned)insize);
    for(i = 0; i != deflatesize; ++i) ucvector_push_back(&outv, deflatedata[i]);
    lodepng_free(deflatedata);
    lodepng_add32bitInt(&outv, ADLER32);
  }

  *out = outv.data;
  *outsize = outv.size;

  return error;
}